

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_TELEPORT_TO(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  chunk_conflict *c;
  player *p;
  loc grid1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  monster *pmVar6;
  monster *mon;
  loc lVar7;
  square *psVar8;
  int x_spread;
  undefined8 unaff_RBP;
  ulong uVar9;
  int iVar10;
  wchar_t dir;
  loc aim;
  int local_54;
  loc local_50;
  uint local_44;
  effect_handler_context_t_conflict *local_40;
  loc local_38;
  
  local_54 = 5;
  pmVar6 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  if ((context->origin).what == SRC_MONSTER) {
    mon = cave_monster(cave,(context->origin).which.grid.x);
    if (mon == (monster *)0x0) {
      __assert_fail("mon",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                    ,0xb1f,"_Bool effect_handler_TELEPORT_TO(effect_handler_context_t *)");
    }
  }
  else {
    mon = (monster *)0x0;
  }
  if ((pmVar6 == (monster *)0x0) && (pmVar6 = mon, context->subtype == 0)) {
    if ((mon != (monster *)0x0) && (_Var2 = monster_is_decoyed(mon), c = cave, _Var2)) {
      lVar7 = cave_find_decoy(cave);
      square_destroy_decoy(c,lVar7);
      return true;
    }
    lVar7.x = (player->grid).x;
    lVar7.y = (player->grid).y;
    _Var2 = square_isno_teleport(cave,lVar7);
    if (_Var2) {
      msg("Teleportation forbidden!");
      return true;
    }
    _Var2 = player_of_has(player,L'\x1d');
    uVar9 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if (_Var2) {
      equip_learn_flag(player,L'\x1d');
      msg("Teleportation forbidden!");
      return true;
    }
  }
  else {
    lVar7.x = (pmVar6->grid).x;
    lVar7.y = (pmVar6->grid).y;
    uVar9 = 0;
  }
  local_44 = (uint)uVar9;
  local_40 = context;
  local_38 = lVar7;
  if ((context->y == 0) || (context->x == 0)) {
    if (mon == (monster *)0x0) {
      do {
        _Var2 = get_aim_dir(&local_54);
        if (!_Var2) {
          return false;
        }
        target_get((loc_conflict *)&local_50);
        if (local_54 != 5) goto LAB_00140e0c;
        _Var2 = los(cave,player->grid,(loc_conflict)local_50);
        if (!_Var2) {
          target_set_location(L'\0',L'\0');
          msg("Target grid must be in view!");
        }
        if (local_54 != 5) goto LAB_00140e0c;
        _Var2 = target_okay();
      } while (!_Var2);
      if (local_54 == 5) {
        target_get((loc_conflict *)&local_50);
      }
      else {
LAB_00140e0c:
        local_50 = (loc)loc_offset((loc_conflict)lVar7,(int)ddx[local_54],(int)ddy[local_54]);
      }
      _Var2 = square_isvault(cave,local_50);
      x_spread = 10;
      if (!_Var2) {
        x_spread = 0;
      }
      bVar1 = true;
      uVar9 = (ulong)local_44;
      goto LAB_00140e53;
    }
    if (context->subtype != 0) {
      local_50.x = (player->grid).x;
      local_50.y = (player->grid).y;
      x_spread = 2;
      bVar1 = false;
      goto LAB_00140e53;
    }
    local_50.x = (mon->grid).x;
    local_50.y = (mon->grid).y;
  }
  else {
    local_50 = (loc)loc(context->x,context->y);
  }
  bVar1 = false;
  x_spread = 0;
LAB_00140e53:
  iVar10 = 0;
  while( true ) {
    do {
      lVar7 = (loc)rand_loc((loc_conflict)local_50,x_spread,x_spread);
      _Var2 = square_in_bounds_fully(cave,lVar7);
    } while (!_Var2);
    _Var2 = has_teleport_destination_prereqs((chunk *)cave,lVar7,SUB81(uVar9,0));
    grid1 = local_38;
    if (_Var2) break;
    iVar3 = (x_spread * 4 + 4) * x_spread;
    iVar4 = iVar10 + 1;
    if (iVar3 < iVar10) {
      iVar4 = 0;
    }
    x_spread = (uint)(iVar3 < iVar10) + x_spread;
    iVar10 = iVar4;
  }
  if ((bVar1) &&
     (_Var2 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)"),
     p = player, _Var2)) {
    wVar5 = distance((loc_conflict)grid1,(loc_conflict)lVar7);
    player_add_speed_boost(p,wVar5 + L'\x14');
  }
  sound(10);
  monster_swap(grid1,lVar7);
  if ((char)local_44 != '\0') {
    player_handle_post_move(player,true,(local_40->origin).what == SRC_MONSTER);
  }
  if (bVar1) {
    target_set_location(L'\0',L'\0');
  }
  psVar8 = square(cave,lVar7);
  flag_off(psVar8->info,3,0x12);
  handle_stuff(player);
  return true;
}

Assistant:

bool effect_handler_TELEPORT_TO(effect_handler_context_t *context)
{
	struct monster *mon = NULL;
	struct loc start, aim, land;
	int dis = 0, ctr = 0, dir = DIR_TARGET;
	struct monster *t_mon = monster_target_monster(context);
	bool friendly = false;
	bool dim_door = false;
	bool player_moves = false;

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	if (context->origin.what == SRC_MONSTER) {
		mon = cave_monster(cave, context->origin.which.monster);
		assert(mon);
	}

	/* Where are we coming from? */
	if (t_mon) {
		/* Monster being teleported */
		start = t_mon->grid;
	} else if (context->subtype) {
		/* Monster teleporting to the player */
		start = mon->grid;
	} else {
		/* Targeted decoys get destroyed */
		if (mon && monster_is_decoyed(mon)) {
			square_destroy_decoy(cave, cave_find_decoy(cave));
			return true;
		}

		/* Player being teleported */
		player_moves = true;
		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start)) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}
	}

	/* Where are we going? */
	if (context->y && context->x) {
		/* Effect was given co-ordinates */
		aim = loc(context->x, context->y);
	} else if (mon) {
		/* Spell cast by monster */
		if (context->subtype) {
			/* Monster teleporting to player */
			aim = player->grid;
			dis = 2;
		} else {
			/* Player being teleported to monster */
			aim = mon->grid;
		}
	} else {
		friendly = true;

		/* Player choice */
		do {
			if (!get_aim_dir(&dir)) return false;

			/* Insist on LoS */
			target_get(&aim);
			if (dir == DIR_TARGET && !los(cave, player->grid, aim)) {
				/* Set a silly target */
				target_set_location(0, 0);
				msg("Target grid must be in view!");
			}
		} while (dir == DIR_TARGET && !target_okay());

		if (dir == DIR_TARGET)
			target_get(&aim);
		else
			aim = loc_offset(start, ddx[dir], ddy[dir]);

		/* Randomise the landing a bit if it's a vault */
		if (square_isvault(cave, aim)) dis = 10;
		dim_door = true;
	}

	/* Find a usable location */
	while (1) {
		/* Pick a nearby legal location */
		while (1) {
			land = rand_loc(aim, dis, dis);
			if (square_in_bounds_fully(cave, land)) break;
		}

		if (has_teleport_destination_prereqs(cave, land,
				player_moves)) break;

		/* Occasionally advance the distance */
		if (++ctr > (4 * dis * dis + 4 * dis + 1)) {
			ctr = 0;
			dis++;
		}
	}

	/* Check for specialty speed boost on friendly teleports */
	if (friendly && player_has(player, PF_PHASEWALK)) {
		player_add_speed_boost(player, 20 + distance(start, land));
	}

	/* Sound */
	sound(MSG_TELEPORT);

	/* Move player or monster */
	monster_swap(start, land);
	if (player_moves) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Cancel target if necessary */
	if (dim_door) {
		target_set_location(0, 0);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, land)->info, SQUARE_PROJECT);

	/* Lots of updates after monster_swap() */
	handle_stuff(player);

	return true;
}